

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O1

void If_CluVerify(word *pF,int nVars,If_Grp_t *g,If_Grp_t *r,word BStruth,word *pFStruth)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  ulong uVar4;
  int nWords_1;
  long lVar5;
  word (*__src) [1024];
  int nWords;
  word *__dest;
  word (*f) [1024];
  word pTTRes [1024];
  word pTTWire [1024];
  word pTTFans [6] [1024];
  word wStack_10040;
  word awStack_10038 [1024];
  word local_e038 [1024];
  word local_c038 [6145];
  
  wStack_10040 = BStruth;
  if (('\x06' < g->nVars) || ('\x06' < r->nVars)) {
    __assert_fail("g->nVars <= 6 && r->nVars <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                  ,0x285,"void If_CluVerify(word *, int, If_Grp_t *, If_Grp_t *, word, word *)");
  }
  if (TruthAll[0][0] == 0) {
    If_CluInitTruthTables();
  }
  cVar1 = g->nVars;
  cVar2 = (char)nVars;
  if (0 < (long)cVar1) {
    uVar3 = 1 << (cVar2 - 6U & 0x1f);
    if (nVars < 7) {
      uVar3 = 1;
    }
    __dest = local_c038;
    lVar5 = 0;
    do {
      if (0 < (int)uVar3) {
        memcpy(__dest,TruthAll + g->pVars[lVar5],(ulong)uVar3 * 8);
      }
      lVar5 = lVar5 + 1;
      __dest = __dest + 0x400;
    } while (cVar1 != lVar5);
  }
  f = (word (*) [1024])local_c038;
  If_CluComposeLut(nVars,g,&wStack_10040,f,local_e038);
  cVar1 = r->nVars;
  if (0 < (long)cVar1) {
    uVar3 = 1 << (cVar2 - 6U & 0x1f);
    if (nVars < 7) {
      uVar3 = 1;
    }
    lVar5 = 0;
    do {
      if (r->pVars[lVar5] == nVars) {
        if (0 < (int)uVar3) {
          __src = &local_e038;
LAB_004162f1:
          memcpy(f,__src,(ulong)uVar3 * 8);
        }
      }
      else if (0 < (int)uVar3) {
        __src = TruthAll + (int)r->pVars[lVar5];
        goto LAB_004162f1;
      }
      lVar5 = lVar5 + 1;
      f = f + 1;
    } while (cVar1 != lVar5);
  }
  If_CluComposeLut(nVars,r,pFStruth,(word (*) [1024])local_c038,awStack_10038);
  uVar3 = 1 << (cVar2 - 6U & 0x1f);
  if (nVars < 7) {
    uVar3 = 1;
  }
  if (0 < (int)uVar3) {
    uVar4 = 0;
    do {
      if (awStack_10038[uVar4] != pF[uVar4]) {
        putchar(10);
        If_CluPrintConfig(nVars,g,r,BStruth,pFStruth);
        Kit_DsdPrintFromTruth((uint *)awStack_10038,nVars);
        putchar(10);
        Kit_DsdPrintFromTruth((uint *)pF,nVars);
        putchar(10);
        puts("Verification FAILED!");
        return;
      }
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  return;
}

Assistant:

void If_CluVerify( word * pF, int nVars, If_Grp_t * g, If_Grp_t * r, word BStruth, word * pFStruth )
{
    word pTTFans[6][CLU_WRD_MAX], pTTWire[CLU_WRD_MAX], pTTRes[CLU_WRD_MAX];
    int i;
    assert( g->nVars <= 6 && r->nVars <= 6 );

    if ( TruthAll[0][0] == 0 )
        If_CluInitTruthTables();

    for ( i = 0; i < g->nVars; i++ )
        If_CluCopy( pTTFans[i], TruthAll[(int)g->pVars[i]], nVars );
    If_CluComposeLut( nVars, g, &BStruth, pTTFans, pTTWire );

    for ( i = 0; i < r->nVars; i++ )
        if ( r->pVars[i] == nVars )
            If_CluCopy( pTTFans[i], pTTWire, nVars );
        else
            If_CluCopy( pTTFans[i], TruthAll[(int)r->pVars[i]], nVars );
    If_CluComposeLut( nVars, r, pFStruth, pTTFans, pTTRes );

    if ( !If_CluEqual(pTTRes, pF, nVars) )
    {
        printf( "\n" );
        If_CluPrintConfig( nVars, g, r, BStruth, pFStruth );
        Kit_DsdPrintFromTruth( (unsigned*)pTTRes, nVars ); printf( "\n" );
        Kit_DsdPrintFromTruth( (unsigned*)pF, nVars ); printf( "\n" );
//        Extra_PrintHex( stdout, (unsigned *)pF, nVars ); printf( "\n" );
        printf( "Verification FAILED!\n" );
    }
//    else
//        printf( "Verification succeed!\n" );
}